

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O2

void qrsolv(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double *x,double *sdiag)

{
  double dVar1;
  int iVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  double *pdVar8;
  double *pdVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double *local_98;
  long local_90;
  double *local_88;
  ulong local_80;
  
  lVar15 = (long)N;
  __ptr = malloc(lVar15 * 8);
  iVar14 = N + 1;
  uVar13 = 0;
  uVar3 = 0;
  if (0 < N) {
    uVar3 = (ulong)(uint)N;
  }
  uVar6 = (ulong)(uint)N;
  uVar4 = uVar6;
  pdVar8 = r;
  for (; uVar13 != uVar3; uVar13 = uVar13 + 1) {
    lVar11 = 0;
    for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
      pdVar8[lVar11] = pdVar8[uVar12];
      lVar11 = lVar11 + lVar15;
    }
    x[uVar13] = r[iVar14 * (int)uVar13];
    *(double *)((long)__ptr + uVar13 * 8) = qtb[uVar13];
    pdVar8 = pdVar8 + lVar15 + 1;
    uVar4 = uVar4 - 1;
  }
  local_98 = r + lVar15;
  local_90 = 1;
  local_88 = sdiag;
  local_80 = uVar6;
  for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
    iVar2 = ipvt[uVar13];
    if ((diag[iVar2] != 0.0) || (NAN(diag[iVar2]))) {
      for (uVar4 = 0; local_80 != uVar4; uVar4 = uVar4 + 1) {
        local_88[uVar4] = 0.0;
      }
      sdiag[uVar13] = diag[iVar2];
      dVar18 = 0.0;
      pdVar8 = local_98;
      lVar11 = local_90;
      for (uVar4 = uVar13; uVar4 != uVar6; uVar4 = uVar4 + 1) {
        dVar16 = sdiag[uVar4];
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          iVar2 = iVar14 * (int)uVar4;
          dVar19 = r[iVar2];
          if (ABS(dVar16) <= ABS(dVar19)) {
            dVar16 = dVar16 / dVar19;
            dVar19 = dVar16 * 0.25 * dVar16 + 0.25;
            if (dVar19 < 0.0) {
              dVar19 = sqrt(dVar19);
            }
            else {
              dVar19 = SQRT(dVar19);
            }
            dVar19 = 0.5 / dVar19;
            dVar16 = dVar16 * dVar19;
          }
          else {
            dVar19 = dVar19 / dVar16;
            dVar16 = dVar19 * 0.25 * dVar19 + 0.25;
            if (dVar16 < 0.0) {
              dVar16 = sqrt(dVar16);
            }
            else {
              dVar16 = SQRT(dVar16);
            }
            dVar16 = 0.5 / dVar16;
            dVar19 = dVar19 * dVar16;
          }
          r[iVar2] = r[iVar2] * dVar19 + sdiag[uVar4] * dVar16;
          dVar1 = *(double *)((long)__ptr + uVar4 * 8);
          dVar17 = dVar18 * dVar16;
          dVar18 = dVar18 * dVar19 - dVar1 * dVar16;
          *(double *)((long)__ptr + uVar4 * 8) = dVar19 * dVar1 + dVar17;
          if ((long)uVar4 <= lVar15 + -2) {
            pdVar9 = pdVar8;
            for (lVar5 = lVar11; lVar5 < lVar15; lVar5 = lVar5 + 1) {
              dVar1 = *pdVar9;
              dVar17 = sdiag[lVar5];
              sdiag[lVar5] = dVar1 * -dVar16 + dVar17 * dVar19;
              *pdVar9 = dVar19 * dVar1 + dVar16 * dVar17;
              pdVar9 = pdVar9 + lVar15;
            }
          }
        }
        lVar11 = lVar11 + 1;
        pdVar8 = pdVar8 + lVar15 + 1;
      }
    }
    iVar2 = iVar14 * (int)uVar13;
    sdiag[uVar13] = r[iVar2];
    r[iVar2] = x[uVar13];
    local_80 = local_80 - 1;
    local_88 = local_88 + 1;
    local_90 = local_90 + 1;
    local_98 = local_98 + lVar15 + 1;
  }
  iVar2 = 1;
  uVar10 = N;
  for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
    uVar7 = iVar2 - 1;
    if (sdiag[uVar13] != 0.0) {
      uVar7 = uVar10;
    }
    if (NAN(sdiag[uVar13])) {
      uVar7 = uVar10;
    }
    if (uVar10 == N) {
      uVar10 = uVar7;
    }
    if ((int)uVar10 < N) {
      *(undefined8 *)((long)__ptr + uVar13 * 8) = 0;
    }
    iVar2 = iVar2 + 1;
  }
  if (0 < (int)uVar10) {
    uVar6 = (ulong)uVar10;
    iVar14 = iVar14 * uVar10 + -1;
    uVar4 = (ulong)(uVar10 + 1);
    for (uVar13 = 1; uVar13 != uVar10 + 1; uVar13 = uVar13 + 1) {
      lVar15 = uVar6 - uVar13;
      dVar18 = 0.0;
      if (lVar15 <= (long)(uVar6 - 2)) {
        iVar2 = iVar14;
        for (lVar11 = (long)(int)uVar4; lVar11 <= (long)uVar6; lVar11 = lVar11 + 1) {
          dVar18 = dVar18 + r[iVar2] * *(double *)((long)__ptr + lVar11 * 8 + -8);
          iVar2 = iVar2 + N;
        }
      }
      *(double *)((long)__ptr + lVar15 * 8) =
           (*(double *)((long)__ptr + lVar15 * 8) - dVar18) / sdiag[lVar15];
      uVar4 = (ulong)((int)uVar4 - 1);
      iVar14 = iVar14 + ~N;
    }
  }
  for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
    x[ipvt[uVar13]] = *(double *)((long)__ptr + uVar13 * 8);
  }
  free(__ptr);
  return;
}

Assistant:

void qrsolv(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double *x,double *sdiag) {
	int i,j,jp1,k,kp1,l,nsing,t;
	double cos,cotan,p5,p25,qtbpj,sin,sum,tan,temp,zero;
	double *wa;

	/*
	 *   This routine is a C translation of Fortran Code by
     *     argonne national laboratory. minpack project. march 1980.
      	  burton s. garbow, kenneth e. hillstrom, jorge j. more
	 * N is a positive integer input variable set to the order of r.

       r is an N by N array. on input the full upper triangle
         must contain the full upper triangle of the matrix r.
         on output the full upper triangle is unaltered, and the
         strict lower triangle contains the strict upper triangle
         (transposed) of the upper triangular matrix s.

       ldr is a positive integer input variable not less than n
         which specifies the leading dimension of the array r.

       ipvt is an integer input array of length N which defines the
         permutation matrix p such that a*p = q*r. column j of p
         is column ipvt(j) of the identity matrix.

       diag is an input array of length N which must contain the
         diagonal elements of the matrix d.

       qtb is an input array of length N which must contain the first
         N elements of the vector (q transpose)*b.

       x is an output array of length N which contains the least
         squares solution of the system a*x = b, d*x = 0.

       sdiag is an output array of length N which contains the
         diagonal elements of the upper triangular matrix s.
	 */

	wa = (double*) malloc(sizeof(double) *N);

	p5 = 5.0e-1;
	p25 = 2.5e-1;
	zero = 0.0;

	//     copy r and (q transpose)*b to preserve input and initialize s.
	//     in particular, save the diagonal elements of r in x.

	for(j = 0; j < N;++j) {
		for(i = j; i < N;++i) {
			r[i*N+j] = r[j*N+i];
		}
		x[j] = r[j*N+j];
		wa[j] = qtb[j];
	}

	//eliminate the diagonal matrix d using a givens rotation.

	for(j = 0; j < N;++j) { //100

		//        prepare the row of d to be eliminated, locating the
		//        diagonal element using p from the qr factorization.

		l = ipvt[j];

		if (diag[l] != zero) { //90
			for(k = j; k < N;++k) {
				sdiag[k] = zero;
			}

			sdiag[j] = diag[l];

			//        the transformations to eliminate the row of d
			//        modify only a single element of (q transpose)*b
			//        beyond the first n, which is initially zero.

			qtbpj = zero;

			for(k = j; k < N;++k) { //80
				t = k * N;
				//     determine a givens rotation which eliminates the
				//     appropriate element in the current row of d.

				if (sdiag[k] != zero) { //70
					if (fabs(r[t+k]) < fabs(sdiag[k])) {
						cotan = r[t+k]/sdiag[k];
			            sin = p5/sqrt(p25+p25*cotan*cotan);
			            cos = sin*cotan;
					} else {
			            tan = sdiag[k]/r[t+k];
			            cos = p5/sqrt(p25+p25*tan*tan);
			            sin = cos*tan;
					}
					//           compute the modified diagonal element of r and
					//           the modified element of ((q transpose)*b,0).
		            r[t+k] = cos*r[t+k] + sin*sdiag[k];
		            temp = cos*wa[k] + sin*qtbpj;
		            qtbpj = -sin*wa[k] + cos*qtbpj;
		            wa[k] = temp;

		            //           accumulate the tranformation in the row of s.
		            kp1 = k + 1;

		            if (N >= kp1+1) {//71
		            	for(i = kp1;i < N;++i) {
		                    temp = cos*r[i*N+k] + sin*sdiag[i];
		                    sdiag[i] = -sin*r[i*N+k] + cos*sdiag[i];
		                    r[i*N+k] = temp;
		            	}
		            }//71
				}//70
			}//80
		} //90
		//        store the diagonal element of s and restore
		//        the corresponding diagonal element of r.

        sdiag[j] = r[j*N+j];
        r[j*N+j] = x[j];

	}//100

	//     solve the triangular system for z. if the system is
	//     singular, then obtain a least squares solution.

	nsing = N;

	for(j = 1; j <= N;++j) {
		if (sdiag[j-1] == zero && nsing == N) {
			nsing = j - 1;
		}
		if (nsing < N) {
			wa[j-1] = zero;
		}
	}

	if (nsing >= 1) {//150
		for(k = 1; k <= nsing;++k) {
	         j = nsing - k + 1;
	         sum = zero;
	         jp1 = j + 1;

	         if (nsing >= jp1) {
	        	 for (i = jp1; i <= nsing;++i) {
	        		 sum = sum + r[(i-1)*N+j-1]*wa[i-1];
	        	 }
	         }
	         wa[j-1] = (wa[j-1] - sum)/sdiag[j-1];
		}
	}//150

	//     permute the components of z back to components of x.

	for (j = 0; j < N;++j) {
        l = ipvt[j];
        x[l] = wa[j];
	}


	free(wa);
}